

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoaderThread.cpp
# Opt level: O0

void __thiscall LoaderThread::Launch(LoaderThread *this,char *filename,uint32_t octree_level)

{
  bool bVar1;
  promise<std::shared_ptr<OctreeBuilder>_> *in_RDI;
  promise<std::shared_ptr<OctreeBuilder>_> *in_stack_ffffffffffffff78;
  thread *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__fut;
  promise<std::shared_ptr<OctreeBuilder>_> *in_stack_ffffffffffffff90;
  future<std::shared_ptr<OctreeBuilder>_> *this_01;
  promise<std::shared_ptr<OctreeBuilder>_> *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffb8;
  element_type *in_stack_ffffffffffffffc0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc8;
  thread in_stack_ffffffffffffffd0;
  
  bVar1 = IsRunning((LoaderThread *)0x17919a);
  if (!bVar1) {
    this_00 = (thread *)&stack0xffffffffffffffd0;
    std::promise<std::shared_ptr<OctreeBuilder>_>::promise(in_stack_ffffffffffffffa0);
    __fut = &in_RDI[2]._M_future.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
    std::promise<std::shared_ptr<OctreeBuilder>_>::operator=(in_stack_ffffffffffffffa0,in_RDI);
    std::promise<std::shared_ptr<OctreeBuilder>_>::~promise(in_stack_ffffffffffffff90);
    this_01 = (future<std::shared_ptr<OctreeBuilder>_> *)&stack0xffffffffffffffc0;
    std::promise<std::shared_ptr<OctreeBuilder>_>::get_future(in_stack_ffffffffffffff78);
    std::future<std::shared_ptr<OctreeBuilder>_>::operator=
              (this_01,(future<std::shared_ptr<OctreeBuilder>_> *)__fut);
    std::future<std::shared_ptr<OctreeBuilder>_>::~future
              ((future<std::shared_ptr<OctreeBuilder>_> *)0x179207);
    std::thread::
    thread<void(LoaderThread::*)(char_const*,unsigned_int),LoaderThread*,char_const*&,unsigned_int&,void>
              ((thread *)in_stack_ffffffffffffffd0._M_id._M_thread,
               (type *)in_stack_ffffffffffffffc8._M_pi,(LoaderThread **)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8,(uint *)0x0);
    std::thread::operator=(this_00,(thread *)in_stack_ffffffffffffff78);
    std::thread::~thread((thread *)0x179261);
  }
  return;
}

Assistant:

void LoaderThread::Launch(const char *filename, uint32_t octree_level) {
	if (IsRunning())
		return;
	m_promise = std::promise<std::shared_ptr<OctreeBuilder>>();
	m_future = m_promise.get_future();
	m_thread = std::thread(&LoaderThread::thread_func, this, filename, octree_level);
}